

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O3

Image * __thiscall
phosg::BitmapImage::to_color
          (Image *__return_storage_ptr__,BitmapImage *this,uint32_t false_color,uint32_t true_color,
          bool add_alpha)

{
  uint32_t uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint8_t uVar5;
  ulong y;
  ulong uVar6;
  
  Image::Image(__return_storage_ptr__,this->width,this->height,add_alpha,'\b');
  uVar4 = this->height;
  if (uVar4 != 0) {
    uVar2 = this->width;
    y = 0;
    uVar6 = uVar2;
    do {
      if (uVar6 == 0) {
        uVar6 = 0;
      }
      else {
        uVar4 = 0;
        do {
          if (uVar2 != uVar4) {
            uVar5 = this->data[(uVar4 >> 3) + this->row_bytes * y];
            uVar6 = 0;
            do {
              uVar1 = false_color;
              if ((char)uVar5 < '\0') {
                uVar1 = true_color;
              }
              Image::write_pixel(__return_storage_ptr__,uVar4 + uVar6,y,(ulong)(uVar1 >> 0x18),
                                 (ulong)(uVar1 >> 0x10 & 0xff),(ulong)(uVar1 >> 8 & 0xff),
                                 (ulong)(uVar1 & 0xff));
              uVar5 = uVar5 * '\x02';
              uVar6 = uVar6 + 1;
              uVar2 = this->width;
              uVar3 = uVar2 - uVar4;
              if (7 < uVar3) {
                uVar3 = 8;
              }
            } while (uVar6 < uVar3);
          }
          uVar4 = uVar4 + 8;
        } while (uVar4 < uVar2);
        uVar4 = this->height;
        uVar6 = uVar2;
      }
      y = y + 1;
    } while (y < uVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

Image BitmapImage::to_color(uint32_t false_color, uint32_t true_color, bool add_alpha) const {
  Image ret(this->width, this->height, add_alpha);
  for (size_t y = 0; y < this->height; y++) {
    for (size_t x = 0; x < this->width; x += 8) {
      uint8_t pending_bits = this->data[(y * this->row_bytes) + (x >> 3)];
      for (size_t z = 0; z < std::min<size_t>(this->width - x, 8); z++) {
        ret.write_pixel(x + z, y, (pending_bits & 0x80) ? true_color : false_color);
        pending_bits <<= 1;
      }
    }
  }
  return ret;
}